

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall wasm::TranslateToFuzzReader::addTag(TranslateToFuzzReader *this)

{
  Module *module;
  Name name;
  Type local_60;
  Type local_58;
  Signature local_50;
  HeapType local_40;
  string_view local_38;
  string_view local_28;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> local_18;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> tag;
  TranslateToFuzzReader *this_local;
  
  module = this->wasm;
  tag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
  super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Tag,_std::default_delete<wasm::Tag>,_true,_true>)
       (__uniq_ptr_data<wasm::Tag,_std::default_delete<wasm::Tag>,_true,_true>)this;
  Name::Name((Name *)&local_38,"tag$");
  local_28 = (string_view)Names::getValidTagName(module,(Name)local_38);
  local_58 = getControlFlowType(this);
  Type::Type(&local_60,none);
  Signature::Signature(&local_50,local_58,local_60);
  wasm::HeapType::HeapType(&local_40,local_50);
  name.super_IString.str._M_str = (char *)local_28._M_len;
  name.super_IString.str._M_len = (size_t)&local_18;
  Builder::makeTag(name,(HeapType)local_28._M_str);
  wasm::Module::addTag((unique_ptr *)this->wasm);
  std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::~unique_ptr(&local_18);
  return;
}

Assistant:

void TranslateToFuzzReader::addTag() {
  auto tag = builder.makeTag(Names::getValidTagName(wasm, "tag$"),
                             Signature(getControlFlowType(), Type::none));
  wasm.addTag(std::move(tag));
}